

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_superblock.c
# Opt level: O0

size_t ZSTD_estimateSubBlockSize_symbolType
                 (symbolEncodingType_e type,BYTE *codeTable,uint maxCode,size_t nbSeq,
                 FSE_CTable *fseCTable,U8 *additionalBits,short *defaultNorm,U32 defaultNormLog,
                 U32 defaultMax,void *workspace,size_t wkspSize)

{
  byte bVar1;
  uint uVar2;
  size_t local_78;
  uint local_6c;
  size_t sStack_68;
  uint max;
  size_t cSymbolTypeSizeEstimateInBits;
  BYTE *ctEnd;
  BYTE *ctStart;
  BYTE *ctp;
  uint *countWksp;
  U8 *additionalBits_local;
  FSE_CTable *fseCTable_local;
  size_t nbSeq_local;
  BYTE *pBStack_20;
  uint maxCode_local;
  BYTE *codeTable_local;
  ulong uStack_10;
  symbolEncodingType_e type_local;
  
  ctp = (BYTE *)workspace;
  cSymbolTypeSizeEstimateInBits = (size_t)(codeTable + nbSeq);
  sStack_68 = 0;
  local_6c = maxCode;
  ctEnd = codeTable;
  ctStart = codeTable;
  countWksp = (uint *)additionalBits;
  additionalBits_local = (U8 *)fseCTable;
  fseCTable_local = (FSE_CTable *)nbSeq;
  nbSeq_local._4_4_ = maxCode;
  pBStack_20 = codeTable;
  codeTable_local._4_4_ = type;
  HIST_countFast_wksp((uint *)workspace,&local_6c,codeTable,nbSeq,workspace,wkspSize);
  if (codeTable_local._4_4_ == set_basic) {
    if (defaultMax < local_6c) {
      __assert_fail("max <= defaultMax",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_superblock.c"
                    ,0x15a,
                    "size_t ZSTD_estimateSubBlockSize_symbolType(symbolEncodingType_e, const BYTE *, unsigned int, size_t, const FSE_CTable *, const U8 *, const short *, U32, U32, void *, size_t)"
                   );
    }
    if (defaultMax < local_6c) {
      local_78 = 0xffffffffffffffff;
    }
    else {
      local_78 = ZSTD_crossEntropyCost(defaultNorm,defaultNormLog,(uint *)ctp,local_6c);
    }
    sStack_68 = local_78;
  }
  else if (codeTable_local._4_4_ == set_rle) {
    sStack_68 = 0;
  }
  else if ((codeTable_local._4_4_ == set_compressed) || (codeTable_local._4_4_ == set_repeat)) {
    sStack_68 = ZSTD_fseBitCost((FSE_CTable *)additionalBits_local,(uint *)ctp,local_6c);
  }
  uVar2 = ERR_isError(sStack_68);
  if (uVar2 == 0) {
    for (; ctStart < cSymbolTypeSizeEstimateInBits; ctStart = ctStart + 1) {
      if (countWksp == (uint *)0x0) {
        bVar1 = *ctStart;
      }
      else {
        bVar1 = *(byte *)((long)countWksp + (ulong)*ctStart);
      }
      sStack_68 = bVar1 + sStack_68;
    }
    uStack_10 = sStack_68 >> 3;
  }
  else {
    uStack_10 = (long)fseCTable_local * 10;
  }
  return uStack_10;
}

Assistant:

static size_t ZSTD_estimateSubBlockSize_symbolType(symbolEncodingType_e type,
                        const BYTE* codeTable, unsigned maxCode,
                        size_t nbSeq, const FSE_CTable* fseCTable,
                        const U8* additionalBits,
                        short const* defaultNorm, U32 defaultNormLog, U32 defaultMax,
                        void* workspace, size_t wkspSize)
{
    unsigned* const countWksp = (unsigned*)workspace;
    const BYTE* ctp = codeTable;
    const BYTE* const ctStart = ctp;
    const BYTE* const ctEnd = ctStart + nbSeq;
    size_t cSymbolTypeSizeEstimateInBits = 0;
    unsigned max = maxCode;

    HIST_countFast_wksp(countWksp, &max, codeTable, nbSeq, workspace, wkspSize);  /* can't fail */
    if (type == set_basic) {
        /* We selected this encoding type, so it must be valid. */
        assert(max <= defaultMax);
        cSymbolTypeSizeEstimateInBits = max <= defaultMax
                ? ZSTD_crossEntropyCost(defaultNorm, defaultNormLog, countWksp, max)
                : ERROR(GENERIC);
    } else if (type == set_rle) {
        cSymbolTypeSizeEstimateInBits = 0;
    } else if (type == set_compressed || type == set_repeat) {
        cSymbolTypeSizeEstimateInBits = ZSTD_fseBitCost(fseCTable, countWksp, max);
    }
    if (ZSTD_isError(cSymbolTypeSizeEstimateInBits)) return nbSeq * 10;
    while (ctp < ctEnd) {
        if (additionalBits) cSymbolTypeSizeEstimateInBits += additionalBits[*ctp];
        else cSymbolTypeSizeEstimateInBits += *ctp; /* for offset, offset code is also the number of additional bits */
        ctp++;
    }
    return cSymbolTypeSizeEstimateInBits / 8;
}